

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

string * __thiscall
glcts::generateBasicVertexSrc_abi_cxx11_
          (string *__return_storage_ptr__,glcts *this,GLSLVersion glslVersion)

{
  char *pcVar1;
  ostream *poVar2;
  stringstream local_1a0 [8];
  stringstream str;
  ostream local_190;
  GLSLVersion local_14;
  string *psStack_10;
  GLSLVersion glslVersion_local;
  
  local_14 = (GLSLVersion)this;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  pcVar1 = glu::getGLSLVersionDeclaration(local_14);
  poVar2 = std::operator<<(&local_190,pcVar1);
  std::operator<<(poVar2,"\n");
  std::operator<<(&local_190,"in highp vec4 a_position;\n");
  if (8 < (int)local_14) {
    std::operator<<(&local_190,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n");
  }
  std::operator<<(&local_190,"void main (void)\n{\n   gl_Position = a_position;\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateBasicVertexSrc(glu::GLSLVersion glslVersion)
{
	std::stringstream str;

	str << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
	str << "in highp vec4 a_position;\n";
	if (glslVersion >= glu::GLSL_VERSION_410)
	{
		str << "out gl_PerVertex {\n"
			   "  vec4 gl_Position;\n"
			   "};\n";
	}
	str << "void main (void)\n"
		   "{\n"
		   "   gl_Position = a_position;\n"
		   "}\n";

	return str.str();
}